

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool local_processing_only)

{
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  bool bVar1;
  type_conflict tVar2;
  Classifier CVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  element_type *peVar7;
  size_type sVar8;
  App *pAVar9;
  reference pvVar10;
  pointer pOVar11;
  string *name;
  Option *this_00;
  _Invoker_type p_Var12;
  undefined1 in_CL;
  undefined4 in_EDX;
  _Alloc_hider in_RSI;
  long in_RDI;
  string res_1;
  string arg;
  size_t remreqpos;
  string current_;
  string res;
  int result_count;
  int collected;
  int tmax;
  int max_num;
  int min_num;
  Option_p *op;
  bool val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nval;
  string v;
  App *sub;
  size_type dotloc;
  shared_ptr<CLI::App> *subc;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string rest;
  string value;
  string arg_name;
  string current;
  value_type *in_stack_fffffffffffff858;
  Option *in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff868;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffff86c;
  App *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  string *in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff888;
  Classifier in_stack_fffffffffffff88c;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  pointer in_stack_fffffffffffff8a0;
  pointer in_stack_fffffffffffff8a8;
  undefined2 uVar14;
  App *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  App *in_stack_fffffffffffff8c0;
  string *in_stack_fffffffffffff8c8;
  undefined2 uVar15;
  App *in_stack_fffffffffffff8d0;
  _Invoker_type p_Var16;
  undefined4 in_stack_fffffffffffff8d8;
  Classifier in_stack_fffffffffffff8dc;
  undefined1 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e1;
  undefined1 uVar17;
  undefined1 in_stack_fffffffffffff8e2;
  undefined1 in_stack_fffffffffffff8e3;
  undefined4 in_stack_fffffffffffff8e4;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff8e8;
  undefined7 in_stack_fffffffffffff900;
  byte bVar18;
  App *in_stack_fffffffffffff930;
  pointer in_stack_fffffffffffff938;
  _Rb_tree_color in_stack_fffffffffffff944;
  undefined4 in_stack_fffffffffffff948;
  _Rb_tree_color in_stack_fffffffffffff94c;
  _Rb_tree_color num;
  undefined1 in_stack_fffffffffffff97f;
  string *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  string *in_stack_fffffffffffff9d8;
  string *in_stack_fffffffffffff9e0;
  Option *in_stack_fffffffffffff9e8;
  undefined8 local_4e0;
  _Invoker_type local_478;
  undefined1 local_469;
  undefined1 in_stack_fffffffffffffba6;
  undefined1 in_stack_fffffffffffffba7;
  undefined8 in_stack_fffffffffffffba8;
  int local_320;
  _Rb_tree_color local_318;
  int local_314;
  int local_310;
  int local_30c;
  reference local_2e8;
  undefined1 local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8 [2];
  allocator<char> local_271;
  App *in_stack_fffffffffffffd90;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_1a8;
  long local_1a0;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_198;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_168;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_160;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_158;
  undefined1 local_14a;
  undefined1 local_122;
  undefined1 local_fa;
  undefined1 local_d1;
  undefined1 local_a0 [123];
  undefined1 in_stack_ffffffffffffffdb;
  Classifier in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar19;
  undefined1 local_1;
  
  uVar19 = CONCAT13(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffff;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff860);
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff870);
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff870);
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff870);
  switch(in_EDX) {
  case 0:
  case 1:
  case 5:
  case 6:
  default:
    local_14a = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
    HorribleError::HorribleError
              ((HorribleError *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    local_14a = 0;
    __cxa_throw(uVar6,&HorribleError::typeinfo,HorribleError::~HorribleError);
  case 2:
    bVar1 = CLI::detail::split_short
                      ((string *)in_stack_fffffffffffff8a8,(string *)in_stack_fffffffffffff8a0,
                       in_stack_fffffffffffff898);
    if (!bVar1) {
      local_fa = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      local_fa = 0;
      __cxa_throw(uVar6,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case 3:
    bVar1 = CLI::detail::split_long
                      (in_stack_fffffffffffff8c8,(string *)in_stack_fffffffffffff8c0,
                       (string *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    if (!bVar1) {
      local_d1 = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff860);
      ::std::operator+((char *)in_stack_fffffffffffff8a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff8a0);
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      local_d1 = 0;
      __cxa_throw(uVar6,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case 4:
    bVar1 = CLI::detail::split_windows_style
                      (in_stack_fffffffffffff8c8,(string *)in_stack_fffffffffffff8c0,
                       (string *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    if (!bVar1) {
      local_122 = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
      HorribleError::HorribleError
                ((HorribleError *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      local_122 = 0;
      __cxa_throw(uVar6,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  local_160 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff858);
  local_168 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff858);
  ::std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  __last._M_current._1_1_ = in_stack_fffffffffffff8e1;
  __last._M_current._0_1_ = in_stack_fffffffffffff8e0;
  __last._M_current._2_1_ = in_stack_fffffffffffff8e2;
  __last._M_current._3_1_ = in_stack_fffffffffffff8e3;
  __last._M_current._4_4_ = in_stack_fffffffffffff8e4;
  local_158 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (in_stack_fffffffffffff8e8,__last,
                         (anon_class_40_2_a297e68f_for__M_pred *)
                         CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
  _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)
  ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
            ((anon_class_40_2_a297e68f_for__M_pred *)0x1d5ffd);
  local_198 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff858);
  bVar1 = __gnu_cxx::
          operator==<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                    ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff860,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff858);
  if (bVar1) {
    local_1a0 = in_RDI + 0x2c0;
    local_1a8._M_current =
         (shared_ptr<CLI::App> *)
         std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                   ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     *)in_stack_fffffffffffff858);
    std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
              ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
               in_stack_fffffffffffff858);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                        ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                          *)in_stack_fffffffffffff860,
                         (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                          *)in_stack_fffffffffffff858);
      uVar15 = (undefined2)((ulong)in_stack_fffffffffffff8c8 >> 0x30);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator*(&local_1a8);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1d60b9
                );
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1d60c5);
      if ((bVar1) &&
         (peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d60db), (peVar7->disabled_ & 1U) == 0)) {
        std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1d60f2);
        bVar1 = _parse_arg((App *)in_RSI._M_p,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT44(in_EDX,uVar19),in_stack_ffffffffffffffdc,
                           (bool)in_stack_ffffffffffffffdb);
        if (bVar1) {
          peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d613a);
          if ((peVar7->pre_parse_called_ & 1U) == 0) {
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1d614d);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI._M_p);
            _trigger_pre_parse((App *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                               CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          }
          local_1 = 1;
          goto LAB_001d7959;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&local_1a8);
    }
    if ((*(long *)(in_RDI + 0x308) == 0) ||
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d61ed)
       , !bVar1)) {
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff860,
                            (char)((ulong)in_stack_fffffffffffff858 >> 0x38),0x1d6222);
      if (sVar8 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffff878,(size_type)in_stack_fffffffffffff870,
                   CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
        pAVar9 = _find_subcommand((App *)CONCAT44(in_stack_fffffffffffff8bc,
                                                  in_stack_fffffffffffff8b8),
                                  (string *)in_stack_fffffffffffff8b0,
                                  SUB81((ulong)in_stack_fffffffffffff8a8 >> 0x38,0),
                                  SUB81((ulong)in_stack_fffffffffffff8a8 >> 0x30,0));
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff860);
        if (pAVar9 != (App *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff860);
          ::std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1d62d8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_fffffffffffff878,(size_type)in_stack_fffffffffffff870,
                     CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8a8);
          uVar14 = (undefined2)((ulong)in_stack_fffffffffffff8a8 >> 0x30);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff860);
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_a0 + 0x40));
          if (sVar8 < 2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (in_stack_fffffffffffff878,(size_type)in_stack_fffffffffffff870,
                       CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
            pvVar10 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff860);
            *pvVar10 = '-';
            sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(local_2b8);
            if (2 < sVar8) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(in_stack_fffffffffffff878,(size_type)in_stack_fffffffffffff870,
                     CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
              ::std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff860);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              resize((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff860,(size_type)in_stack_fffffffffffff858);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff870,
                        (value_type *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868))
            ;
            in_EDX = 2;
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff860);
          }
          else {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff8a0,(char *)in_stack_fffffffffffff898,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (in_stack_fffffffffffff878,(size_type)in_stack_fffffffffffff870,
                       CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868));
            ::std::operator+(in_stack_fffffffffffff898,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff860);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff860);
            ::std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff860);
            ::std::allocator<char>::~allocator(&local_271);
            in_EDX = 3;
          }
          local_2d9 = _parse_arg((App *)in_RSI._M_p,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)CONCAT44(in_EDX,uVar19),in_stack_ffffffffffffffdc,
                                 (bool)in_stack_ffffffffffffffdb);
          if ((bool)local_2d9) {
            if ((pAVar9->silent_ & 1U) == 0) {
              std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)
                         in_stack_fffffffffffff870,
                         (value_type *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868)
                        );
            }
            increment_parsed(in_stack_fffffffffffff870);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RSI._M_p);
            _trigger_pre_parse((App *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                               CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
            bVar1 = ::std::function::operator_cast_to_bool((function<void_()> *)0x1d66bb);
            if (bVar1) {
              _process_env(in_stack_fffffffffffff930);
              _process_callbacks(in_stack_fffffffffffff8c0);
              _process_help_flags(in_stack_fffffffffffff8b0,SUB21((ushort)uVar14 >> 8,0),
                                  SUB21(uVar14,0));
              _process_requirements(in_stack_fffffffffffffd90);
              run_callback(in_stack_fffffffffffff8d0,SUB21((ushort)uVar15 >> 8,0),SUB21(uVar15,0));
            }
            local_1 = 1;
            bVar1 = true;
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x1d673b);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff870,
                        (value_type *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868))
            ;
            bVar1 = false;
          }
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff860);
          if (bVar1) goto LAB_001d7959;
        }
      }
      if ((uVar19 & 0x1000000) == 0) {
        if ((*(long *)(in_RDI + 0x308) == 0) || ((*(byte *)(in_RDI + 0x2da) & 1) == 0)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1d6841);
          _move_to_missing((App *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                           in_stack_fffffffffffff88c,in_stack_fffffffffffff880);
          local_1 = 1;
        }
        else {
          _get_fallthrough_parent(in_stack_fffffffffffff8b0);
          local_1 = _parse_arg((App *)in_RSI._M_p,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_EDX,uVar19),in_stack_ffffffffffffffdc,
                               (bool)in_stack_ffffffffffffffdb);
        }
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
    goto LAB_001d7959;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1d6884);
  local_2e8 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&local_158);
  pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d68a6);
  bVar1 = Option::get_inject_separator(pOVar11);
  if (bVar1) {
    pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d68d4);
    Option::results_abi_cxx11_(pOVar11);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff870);
    if (!bVar1) {
      pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d68f9);
      Option::results_abi_cxx11_(pOVar11);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff860);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1d6911);
      if (!bVar1) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6922);
        ::std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff870);
        Option::add_result(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff860);
      }
    }
  }
  pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d699a);
  bVar1 = Option::get_trigger_on_parse(pOVar11);
  if ((bVar1) &&
     (pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d69c5),
     pOVar11->current_option_state_ == callback_run)) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d69db);
    Option::clear(in_stack_fffffffffffff860);
  }
  pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d69f0);
  local_310 = Option::get_type_size_min(pOVar11);
  pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6a1c);
  local_314 = Option::get_items_expected_min(pOVar11);
  name = (string *)std::min<int>(&local_310,&local_314);
  local_30c = *(int *)&(name->_M_dataplus)._M_p;
  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6a68);
  local_318 = Option::get_items_expected_max(in_stack_fffffffffffff860);
  num = local_318;
  if (0x1ffffff < (int)local_318) {
    pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6aa5);
    bVar1 = Option::get_allow_extra_args(pOVar11);
    if (!bVar1) {
      pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6ad4);
      in_stack_fffffffffffff944 = Option::get_type_size_max(pOVar11);
      in_stack_fffffffffffff94c = in_stack_fffffffffffff944;
      pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6b00);
      Option::get_expected_min(pOVar11);
      tVar2 = CLI::detail::checked_multiply<int>
                        ((int *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                         (int)((ulong)in_stack_fffffffffffff860 >> 0x20));
      in_stack_fffffffffffff948 = CONCAT13(tVar2,(int3)in_stack_fffffffffffff948);
      local_318 = in_stack_fffffffffffff944;
      if (!tVar2) {
        in_stack_fffffffffffff944 = 0x20000000;
        local_318 = in_stack_fffffffffffff944;
      }
    }
  }
  if (local_318 == _S_red) {
    in_stack_fffffffffffff938 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6b8a);
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    Option::get_flag_value
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6bea);
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    Option::add_result(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               in_stack_fffffffffffff860);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff860,
               (value_type *)in_stack_fffffffffffff858);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
  }
  else {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d6cfd
                      );
    if (bVar1) {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1d6dec);
      if (!bVar1) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6e01);
        ::std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
        Option::add_result((Option *)in_stack_fffffffffffff870,
                           (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                           (int *)in_stack_fffffffffffff860);
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff860);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                   in_stack_fffffffffffff860);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)
                   in_stack_fffffffffffff860,(value_type *)in_stack_fffffffffffff858);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
      }
    }
    else {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6d12);
      ::std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Option::add_result((Option *)in_stack_fffffffffffff870,
                         (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                         (int *)in_stack_fffffffffffff860);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff860);
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                 in_stack_fffffffffffff860);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff860,
                 (value_type *)in_stack_fffffffffffff858);
    }
  }
  local_320 = 0;
  while( true ) {
    bVar18 = 0;
    if (0 < local_30c) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff870);
      bVar18 = bVar1 ^ 0xff;
    }
    uVar17 = (undefined1)(in_stack_fffffffffffff88c >> 0x18);
    if ((bVar18 & 1) == 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff860);
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1d6f52);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d6f5f);
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    Option::add_result((Option *)in_stack_fffffffffffff870,
                       (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                       (int *)in_stack_fffffffffffff860);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               in_stack_fffffffffffff860);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff860,
               (value_type *)in_stack_fffffffffffff858);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
  }
  if (0 < local_30c) {
    local_469 = 1;
    this_00 = (Option *)__cxa_allocate_exception(0x38);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d7097);
    Option::get_name_abi_cxx11_
              ((Option *)in_stack_fffffffffffffba8,(bool)in_stack_fffffffffffffba7,
               (bool)in_stack_fffffffffffffba6);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d70c8);
    Option::get_type_name_abi_cxx11_(this_00);
    ArgumentMismatch::TypedAtLeast
              ((string *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               in_stack_fffffffffffff944,(string *)in_stack_fffffffffffff938);
    local_469 = 0;
    __cxa_throw(this_00,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
  }
  if (0 < (int)local_318) {
LAB_001d71de:
    local_478 = (_Invoker_type)
                _count_remaining_positionals
                          ((App *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                           (bool)uVar17);
    do {
      if ((int)local_318 < 1) {
        pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d7215)
        ;
        in_stack_fffffffffffff8e2 = Option::get_allow_extra_args(pOVar11);
        uVar17 = false;
        if ((bool)in_stack_fffffffffffff8e2) goto LAB_001d723d;
      }
      else {
LAB_001d723d:
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff870);
        uVar17 = false;
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff860);
          in_stack_fffffffffffff8dc =
               _recognize((App *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                          in_stack_fffffffffffff980,(bool)in_stack_fffffffffffff97f);
          uVar17 = in_stack_fffffffffffff8dc == NONE;
        }
      }
      if (((bool)uVar17 == false) ||
         (p_Var16 = local_478,
         p_Var12 = (_Invoker_type)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_RSI._M_p), p_Var12 <= p_Var16)) goto LAB_001d74a4;
      if ((*(byte *)(in_RDI + 0x2e0) & 1) != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff860);
        ::std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d7313);
        Option::_validate((Option *)in_stack_fffffffffffff8e8._M_current,
                          (string *)
                          CONCAT44(in_stack_fffffffffffff8e4,
                                   CONCAT13(in_stack_fffffffffffff8e3,
                                            CONCAT12(in_stack_fffffffffffff8e2,
                                                     CONCAT11(uVar17,in_stack_fffffffffffff8e0)))),
                          in_stack_fffffffffffff8dc);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8a8);
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff860);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d735e)
        ;
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff860);
        if (!bVar1) goto LAB_001d74a4;
      }
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d73ce);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff860);
      ::std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Option::add_result((Option *)in_stack_fffffffffffff870,
                         (string *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                         (int *)in_stack_fffffffffffff860);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff860);
      local_4e0 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                             in_stack_fffffffffffff860);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff860,
                 (value_type *)in_stack_fffffffffffff858);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1d7464);
    } while( true );
  }
  pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d71bd);
  in_stack_fffffffffffff8e3 = Option::get_allow_extra_args(pOVar11);
  if ((bool)in_stack_fffffffffffff8e3) goto LAB_001d71de;
LAB_001d7675:
  if (0 < local_30c) {
    pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d769b);
    iVar4 = Option::get_type_size_max(pOVar11);
    if (local_320 % iVar4 != 0) {
      pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d76ca);
      iVar4 = Option::get_type_size_max(pOVar11);
      pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d76e5);
      iVar5 = Option::get_type_size_min(pOVar11);
      if (iVar4 == iVar5) {
        uVar6 = __cxa_allocate_exception(0x38);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d7790);
        Option::get_name_abi_cxx11_
                  ((Option *)in_stack_fffffffffffffba8,(bool)in_stack_fffffffffffffba7,
                   (bool)in_stack_fffffffffffffba6);
        pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d77b3)
        ;
        Option::get_type_size_min(pOVar11);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d77ce);
        Option::get_type_name_abi_cxx11_((Option *)in_stack_fffffffffffff8e8._M_current);
        ArgumentMismatch::PartialType
                  (name,num,(string *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948))
        ;
        __cxa_throw(uVar6,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d770c);
      ::std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff870);
      Option::add_result(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff860);
    }
  }
  pOVar11 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d78a9);
  bVar1 = Option::get_trigger_on_parse(pOVar11);
  uVar13 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff868);
  if (bVar1) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d78ce);
    Option::run_callback((Option *)CONCAT17(bVar18,in_stack_fffffffffffff900));
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d78e7);
  if (!bVar1) {
    ::std::operator+((char *)in_stack_fffffffffffff8a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8a0);
    in_stack_fffffffffffff860 = (Option *)local_a0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a8);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff870,
                (value_type *)CONCAT44(in_stack_fffffffffffff86c,uVar13));
  }
  local_1 = 1;
LAB_001d7959:
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff860);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff860);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff860);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff860);
  return (bool)(local_1 & 1);
LAB_001d74a4:
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff870);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff860);
    CVar3 = _recognize((App *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                       in_stack_fffffffffffff980,(bool)in_stack_fffffffffffff97f);
    if (CVar3 == POSITIONAL_MARK) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1d74f3);
    }
  }
  if ((local_30c == 0) && (0 < (int)local_318)) {
    in_stack_fffffffffffff8a8 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d752a);
    in_stack_fffffffffffff8b0 = (App *)&stack0xfffffffffffffae0;
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff870);
    Option::get_flag_value
              (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
    in_stack_fffffffffffff8a0 =
         std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                   ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1d757c);
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
    Option::add_result(in_stack_fffffffffffff860,in_stack_fffffffffffff858);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               in_stack_fffffffffffff860);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              ((vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *)in_stack_fffffffffffff860,
               (value_type *)in_stack_fffffffffffff858);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff860);
  }
  goto LAB_001d7675;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    if(op_ptr == std::end(options_)) {
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}